

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * tabdesc(disctx *ctx,match m,atom *atoms)

{
  int iVar1;
  int iVar2;
  int iVar3;
  matches *pmVar4;
  matches *__ptr;
  matches *b;
  match *pmVar5;
  long lVar6;
  long lVar7;
  match *pmVar8;
  undefined8 *puVar9;
  byte bVar10;
  match in_stack_ffffffffffffff18;
  
  bVar10 = 0;
  if (atoms->fun == (afun)0x0) {
    __ptr = (matches *)calloc(0x10,1);
    iVar1 = __ptr->mnum;
    iVar2 = __ptr->mmax;
    if (iVar2 <= iVar1) {
      iVar3 = 0x10;
      if (iVar2 != 0) {
        iVar3 = iVar2 * 2;
      }
      __ptr->mmax = iVar3;
      pmVar5 = (match *)realloc(__ptr->m,(long)iVar3 * 0xb8);
      __ptr->m = pmVar5;
    }
    __ptr->mnum = iVar1 + 1;
    memcpy(__ptr->m + iVar1,&m,0xb8);
  }
  else {
    pmVar4 = (*atoms->fun)(ctx,(ull *)0x0,(ull *)0x0,atoms->arg,m.lpos);
    __ptr = (matches *)0x0;
    if (pmVar4 != (matches *)0x0) {
      pmVar5 = &m;
      puVar9 = (undefined8 *)&stack0xffffffffffffff18;
      for (lVar6 = 0x17; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar9 = *(undefined8 *)pmVar5;
        pmVar5 = (match *)((long)pmVar5 + (ulong)bVar10 * -0x10 + 8);
        puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
      }
      __ptr = mergematches(in_stack_ffffffffffffff18,pmVar4);
      if (atoms[1].fun != (afun)0x0) {
        pmVar4 = (matches *)calloc(0x10,1);
        lVar6 = (long)__ptr->mnum;
        if (0 < lVar6) {
          pmVar5 = __ptr->m;
          do {
            pmVar8 = pmVar5;
            puVar9 = (undefined8 *)&stack0xffffffffffffff18;
            for (lVar7 = 0x17; lVar7 != 0; lVar7 = lVar7 + -1) {
              *puVar9 = *(undefined8 *)pmVar8;
              pmVar8 = (match *)((long)pmVar8 + ((ulong)bVar10 * -2 + 1) * 8);
              puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
            }
            b = tabdesc(ctx,in_stack_ffffffffffffff18,atoms + 1);
            if (b != (matches *)0x0) {
              catmatches(pmVar4,b);
            }
            pmVar5 = pmVar5 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        free(__ptr->m);
        free(__ptr);
        __ptr = pmVar4;
      }
    }
  }
  return __ptr;
}

Assistant:

struct matches *tabdesc (struct disctx *ctx, struct match m, const struct atom *atoms) {
	if (!atoms->fun) {
		struct matches *res = emptymatches();
		ADDARRAY(res->m, m);
		return res;
	}
	struct matches *ms = atoms->fun(ctx, 0, 0, atoms->arg, m.lpos);
	if (!ms)
		return 0;
	ms = mergematches(m, ms);
	atoms++;
	if (!atoms->fun)
		return ms;
	struct matches *res = emptymatches();
	int i;
	for (i = 0; i < ms->mnum; i++) {
		struct matches *tmp = tabdesc(ctx, ms->m[i], atoms);
		if (tmp)
			res = catmatches(res, tmp);
	}
	free(ms->m);
	free(ms);
	return res;
}